

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yprp_inout(lys_ypr_ctx_conflict *pctx,lysp_node_action_inout *inout,int8_t *flag)

{
  uint16_t *puVar1;
  lysp_restr *plVar2;
  lysp_tpdf *plVar3;
  lysp_node_grp *grp;
  lysp_node *node;
  ly_stmt substmt;
  lysp_ext_instance *plVar4;
  ulong uVar5;
  lysp_ext_instance *plVar6;
  int8_t *flag_00;
  lysp_node_grp **pplVar7;
  long lVar8;
  ulong uVar9;
  lysp_node **pplVar10;
  
  if (inout->child != (lysp_node *)0x0) {
    pplVar10 = &inout->child;
    ypr_close_parent(pctx,flag);
    lVar8 = 0;
    ypr_open(pctx,(inout->field_0).node.name,(char *)0x0,(char *)0x0,*flag);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    substmt = lyplg_ext_nodetype2stmt((inout->field_0).node.nodetype);
    flag_00 = (int8_t *)0x0;
    yprp_extension_instances(pctx,substmt,'\0',(inout->field_0).node.exts,(int8_t *)0x0);
    plVar6 = (lysp_ext_instance *)0x0;
    while( true ) {
      plVar2 = inout->musts;
      if (plVar2 == (lysp_restr *)0x0) {
        plVar4 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar4 = plVar2[-1].exts;
      }
      if (plVar4 <= plVar6) break;
      yprp_restr(pctx,(lysp_restr *)((long)&(plVar2->arg).str + lVar8),LY_STMT_MUST,"condition",
                 flag_00);
      plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
      lVar8 = lVar8 + 0x40;
    }
    lVar8 = 0;
    uVar9 = 0;
    while( true ) {
      plVar3 = inout->typedefs;
      if (plVar3 == (lysp_tpdf *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ulong *)&plVar3[-1].flags;
      }
      if (uVar5 <= uVar9) break;
      yprp_typedef(pctx,(lysp_tpdf *)((long)&plVar3->name + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0xb0;
    }
    pplVar7 = &inout->groupings;
    while (grp = *pplVar7, grp != (lysp_node_grp *)0x0) {
      yprp_grouping(pctx,grp);
      pplVar7 = &(grp->field_0).field_1.next;
    }
    while (node = *pplVar10, node != (lysp_node *)0x0) {
      yprp_node(pctx,node);
      pplVar10 = &node->next;
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,(inout->field_0).node.name,'\x01');
    return;
  }
  return;
}

Assistant:

static void
yprp_inout(struct lys_ypr_ctx *pctx, const struct lysp_node_action_inout *inout, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_node *data;
    struct lysp_node_grp *grp;

    if (!inout->child) {
        /* no children */
        return;
    }
    ypr_open(pctx->out, flag);
    YPR_EXTRA_LINE_PRINT(pctx);

    ly_print_(pctx->out, "%*s%s {\n", INDENT, inout->name);
    LEVEL++;

    yprp_extension_instances(pctx, lyplg_ext_nodetype2stmt(inout->nodetype), 0, inout->exts, NULL);
    LY_ARRAY_FOR(inout->musts, u) {
        yprp_restr(pctx, &inout->musts[u], LY_STMT_MUST, NULL);
    }
    LY_ARRAY_FOR(inout->typedefs, u) {
        yprp_typedef(pctx, &inout->typedefs[u]);
    }
    LY_LIST_FOR(inout->groupings, grp) {
        yprp_grouping(pctx, grp);
    }

    LY_LIST_FOR(inout->child, data) {
        yprp_node(pctx, data);
    }

    LEVEL--;
    ypr_close(pctx, 1);
}